

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O3

int nni_sfd_listener_alloc(nng_stream_listener **lp,nng_url *url)

{
  int iVar1;
  nng_stream_listener *pnVar2;
  
  pnVar2 = (nng_stream_listener *)nni_zalloc(0xd8);
  if (pnVar2 == (nng_stream_listener *)0x0) {
    iVar1 = 2;
  }
  else {
    pnVar2[1].sl_set = (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0;
    pnVar2[1].sl_get_tls = (_func_int_void_ptr_nng_tls_config_ptr_ptr *)0x0;
    pnVar2[1].sl_accept = (_func_void_void_ptr_nng_aio_ptr *)0x0;
    pnVar2[1].sl_get = (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0;
    pnVar2[1].sl_stop = (_func_void_void_ptr *)0x0;
    pnVar2[1].sl_listen = (_func_int_void_ptr *)0x0;
    pnVar2[1].sl_free = (_func_void_void_ptr *)0x0;
    pnVar2[1].sl_close = (_func_void_void_ptr *)0x0;
    *(undefined4 *)&pnVar2[1].sl_set_tls = 0;
    nni_aio_list_init((nni_list *)&pnVar2[1].sl_set_security_descriptor);
    nni_mtx_init((nni_mtx *)&pnVar2[2].sl_stop);
    pnVar2->sl_free = sfd_listener_free;
    pnVar2->sl_close = sfd_listener_close;
    pnVar2->sl_stop = sfd_listener_stop;
    pnVar2->sl_listen = sfd_listener_listen;
    pnVar2->sl_accept = sfd_listener_accept;
    pnVar2->sl_get = sfd_listener_get;
    pnVar2->sl_set = sfd_listener_set;
    *lp = pnVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_sfd_listener_alloc(nng_stream_listener **lp, const nng_url *url)
{
	sfd_listener *l;

	NNI_ARG_UNUSED(url);

	if ((l = NNI_ALLOC_STRUCT(l)) == NULL) {
		return (NNG_ENOMEM);
	}
	memset(l->listen_q, 0, sizeof(l->listen_q));
	l->listen_cnt = 0;
	nni_aio_list_init(&l->accept_q);
	nni_mtx_init(&l->mtx);

	l->ops.sl_free   = sfd_listener_free;
	l->ops.sl_close  = sfd_listener_close;
	l->ops.sl_stop   = sfd_listener_stop;
	l->ops.sl_listen = sfd_listener_listen;
	l->ops.sl_accept = sfd_listener_accept;
	l->ops.sl_get    = sfd_listener_get;
	l->ops.sl_set    = sfd_listener_set;

	*lp = (void *) l;
	return (0);
}